

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuList.c
# Opt level: O3

void Fxu_ListTableAddDivisor(Fxu_Matrix *p,Fxu_Double *pLink)

{
  Fxu_ListDouble *pFVar1;
  Fxu_Double *pFVar2;
  
  pFVar1 = p->pTable + pLink->Key;
  if (pFVar1->pHead == (Fxu_Double *)0x0) {
    pFVar1->pHead = pLink;
    pFVar1->pTail = pLink;
    pLink->pNext = (Fxu_Double *)0x0;
    pFVar2 = (Fxu_Double *)0x0;
  }
  else {
    pLink->pNext = (Fxu_Double *)0x0;
    pFVar2 = pFVar1->pTail;
    pFVar2->pNext = pLink;
    pFVar1->pTail = pLink;
  }
  pLink->pPrev = pFVar2;
  pFVar1->nItems = pFVar1->nItems + 1;
  p->nDivs = p->nDivs + 1;
  return;
}

Assistant:

void Fxu_ListTableAddDivisor( Fxu_Matrix * p, Fxu_Double * pLink ) 
{
	Fxu_ListDouble * pList = &(p->pTable[pLink->Key]);
	if ( pList->pHead == NULL )
	{
		pList->pHead = pLink;
		pList->pTail = pLink;
		pLink->pPrev = NULL;
		pLink->pNext = NULL;
	}
	else
	{
		pLink->pNext = NULL;
		pList->pTail->pNext = pLink;
		pLink->pPrev = pList->pTail;
		pList->pTail = pLink;
	}
	pList->nItems++;
    p->nDivs++;
}